

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O1

int gdImageEmboss(gdImagePtr im)

{
  int iVar1;
  float filter [3] [3];
  float local_28 [10];
  
  local_28[2] = 0.0;
  local_28[3] = 0.0;
  local_28[4] = 0.0;
  local_28[5] = 0.0;
  local_28[6] = 0.0;
  local_28[7] = 0.0;
  local_28[0] = 1.5;
  local_28[1] = 0.0;
  local_28[8] = -1.5;
  iVar1 = gdImageConvolution(im,(float (*) [3])local_28,1.0,127.0);
  return iVar1;
}

Assistant:

BGD_DECLARE(int) gdImageEmboss(gdImagePtr im)
{
/*
	float filter[3][3] =	{{1.0,1.0,1.0},
				{0.0,0.0,0.0},
				{-1.0,-1.0,-1.0}};
*/
	float filter[3][3] =	{{ 1.5, 0.0, 0.0},
				 { 0.0, 0.0, 0.0},
				 { 0.0, 0.0,-1.5}};

	return gdImageConvolution(im, filter, 1, 127);
}